

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O1

StringResult<QByteArray> * __thiscall
QCborStreamReader::_readUtf8String_helper
          (StringResult<QByteArray> *__return_storage_ptr__,QCborStreamReader *this)

{
  StringResultCode SVar1;
  ReadStringChunk params;
  StringResult<long_long> SVar2;
  
  (__return_storage_ptr__->data).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&__return_storage_ptr__->status = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->data).d.d = (Data *)0x0;
  (__return_storage_ptr__->data).d.ptr = (char *)0x0;
  (__return_storage_ptr__->data).d.size = 0;
  __return_storage_ptr__->status = Error;
  params.maxlen_or_type = -5;
  params.field_0.array = &__return_storage_ptr__->data;
  SVar2 = QCborStreamReaderPrivate::readStringChunk(*(QCborStreamReaderPrivate **)(this + 8),params)
  ;
  SVar1 = SVar2.status;
  __return_storage_ptr__->status = SVar1;
  if (SVar1 == EndOfString) {
    if (*(int *)(*(long *)(this + 8) + 0x60) == 0) {
      preparse(this);
    }
  }
  else if (SVar1 == Error) {
    QByteArray::clear(&__return_storage_ptr__->data);
  }
  return __return_storage_ptr__;
}

Assistant:

QCborStreamReader::StringResult<QByteArray> QCborStreamReader::_readUtf8String_helper()
{
    using P = QCborStreamReaderPrivate::ReadStringChunk;
    QCborStreamReader::StringResult<QByteArray> result;
    auto r = d->readStringChunk(P{ &result.data, P::Utf8String });
    result.status = r.status;
    if (r.status == Error) {
        result.data.clear();
    } else {
        Q_ASSERT(r.data == result.data.size());
        if (r.status == EndOfString && lastError() == QCborError::NoError)
            preparse();
    }

    return result;
}